

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_test.cpp
# Opt level: O0

int count_files(void)

{
  char *__name;
  ostream *poVar1;
  runtime_error *this;
  dirent *pdVar2;
  size_t sVar3;
  dirent *de;
  int counter;
  ostringstream oss;
  DIR *d;
  int local_1b8;
  string local_1b0 [48];
  ostringstream local_180 [376];
  DIR *local_8;
  
  __name = (char *)std::__cxx11::string::c_str();
  local_8 = opendir(__name);
  if (local_8 == (DIR *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_180);
    poVar1 = std::operator<<((ostream *)local_180,"Error ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/storage_test.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x46);
    std::operator<<(poVar1," d");
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(this,local_1b0);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1b8 = 0;
  while (pdVar2 = readdir(local_8), pdVar2 != (dirent *)0x0) {
    sVar3 = strlen(pdVar2->d_name);
    if (sVar3 == 0x20) {
      local_1b8 = local_1b8 + 1;
    }
  }
  closedir(local_8);
  return local_1b8;
}

Assistant:

int count_files()
{
#ifndef CPPCMS_WIN_NATIVE
	DIR *d=opendir(dir.c_str());
	TEST(d);
	int counter = 0;
	struct dirent *de;
	while((de=readdir(d))!=0) {
		if(strlen(de->d_name)==32)
			counter++;
	}
	closedir(d);
	return counter;
#else
	WIN32_FIND_DATA entry;
	HANDLE d=FindFirstFile((dir+"/*").c_str(),&entry);
	int counter=0;
	if(d==INVALID_HANDLE_VALUE) {
		return 0;
	}
	do {
		if(strlen(entry.cFileName)==32)
			counter++;
	}while(FindNextFile(d,&entry));
	FindClose(d);
	return counter;
#endif
}